

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O1

string * parse_util::get_param
                   (string *__return_storage_ptr__,string *instr,string *open_par,string *close_par)

{
  long lVar1;
  long *local_48 [2];
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar1 = std::__cxx11::string::find((char *)instr,(ulong)(open_par->_M_dataplus)._M_p,0);
  if (lVar1 != -1) {
    std::__cxx11::string::find_last_of
              ((char *)instr,(ulong)(close_par->_M_dataplus)._M_p,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_48,(ulong)instr);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string get_param(const string &instr, const string &open_par,
                     const string &close_par)
    {
        string temp("");
        string::size_type pos = instr.find(open_par);

        if (pos != string::npos) {
            string::size_type end = instr.find_last_of(close_par);
            temp = instr.substr(pos+1, end-pos-1);
        }

        return temp;
    }